

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O0

size_t Assimp::Write<aiMatrix4x4t<float>>(IOStream *stream,aiMatrix4x4 *m)

{
  float *pfVar1;
  uint local_20;
  uint local_1c;
  uint i2;
  uint i;
  aiMatrix4x4 *m_local;
  IOStream *stream_local;
  
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
      pfVar1 = aiMatrix4x4t<float>::operator[](m,local_1c);
      Write<float>(stream,pfVar1 + local_20);
    }
  }
  return 0x40;
}

Assistant:

inline
size_t Write<aiMatrix4x4>(IOStream * stream, const aiMatrix4x4& m) {
    for (unsigned int i = 0; i < 4;++i) {
        for (unsigned int i2 = 0; i2 < 4;++i2) {
            Write<float>(stream,m[i][i2]);
        }
    }

    return 64;
}